

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

void __thiscall argparse::ArgumentParser::parse_args_validate(ArgumentParser *this)

{
  iterator iVar1;
  iterator iVar2;
  ArgumentParser *this_local;
  
  iVar1 = std::
          begin<std::map<std::basic_string_view<char,std::char_traits<char>>,std::_List_iterator<argparse::Argument>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>>
                    (&this->mArgumentMap);
  iVar2 = std::
          end<std::map<std::basic_string_view<char,std::char_traits<char>>,std::_List_iterator<argparse::Argument>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>>
                    (&this->mArgumentMap);
  std::
  for_each<std::_Rb_tree_iterator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>,argparse::ArgumentParser::parse_args_validate()::_lambda(auto:1_const&)_1_>
            (iVar1._M_node,iVar2._M_node);
  return;
}

Assistant:

void parse_args_validate() {
    // Check if all arguments are parsed
    std::for_each(std::begin(mArgumentMap), std::end(mArgumentMap),
                  [](const auto &argPair) {
                    const auto &tArgument = argPair.second;
                    tArgument->validate();
                  });
  }